

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O3

float4x4 * ConvexDecomposition::Inverse(float4x4 *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float4 fVar10;
  float *dst;
  float4x4 *in_RDI;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [64];
  float4x4 fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  
  auVar36 = _DAT_009f1130;
  auVar30._0_4_ = (m->z).x;
  auVar30._4_4_ = (m->z).y;
  auVar30._8_4_ = (m->z).z;
  auVar30._12_4_ = (m->z).w;
  auVar30._16_4_ = (m->w).x;
  auVar30._20_4_ = (m->w).y;
  auVar30._24_4_ = (m->w).z;
  auVar30._28_4_ = (m->w).w;
  auVar5._0_4_ = (m->x).x;
  auVar5._4_4_ = (m->x).y;
  auVar5._8_4_ = (m->x).z;
  auVar5._12_4_ = (m->x).w;
  auVar5._16_4_ = (m->y).x;
  auVar5._20_4_ = (m->y).y;
  auVar5._24_4_ = (m->y).z;
  auVar5._28_4_ = (m->y).w;
  fVar1 = (m->z).y;
  fVar2 = (m->x).y;
  fVar3 = (m->y).y;
  fVar4 = (m->w).y;
  auVar27 = vpermi2ps_avx512vl(ZEXT1632(_DAT_009f1120),auVar5,auVar30);
  auVar28 = vpermi2ps_avx512vl(ZEXT1632(_DAT_009f1110),auVar5,auVar30);
  auVar29 = vpermi2ps_avx512vl(ZEXT1632(_DAT_009f10f0),auVar5,auVar30);
  auVar30 = vpermi2ps_avx512vl(ZEXT1632(_DAT_009f1100),auVar5,auVar30);
  auVar12 = auVar27._0_16_;
  auVar11 = vshufps_avx(auVar12,auVar12,0xf);
  auVar33 = auVar28._0_16_;
  auVar6 = vshufps_avx(auVar33,auVar33,0xe7);
  auVar7 = vshufps_avx(auVar12,auVar12,0xb9);
  auVar8 = vshufps_avx(auVar33,auVar33,0x24);
  auVar35 = auVar29._0_16_;
  auVar9 = vshufps_avx(auVar35,auVar35,0x5a);
  auVar24 = vshufps_avx(auVar35,auVar35,1);
  auVar25 = vshufps_avx(auVar35,auVar35,0xbf);
  auVar26 = vshufps_avx(auVar12,auVar12,0xbf);
  auVar34 = vshufps_avx(auVar12,auVar12,1);
  auVar40._0_4_ = auVar11._0_4_ * auVar28._0_4_;
  auVar40._4_4_ = auVar11._4_4_ * auVar28._4_4_;
  auVar40._8_4_ = auVar11._8_4_ * auVar28._8_4_;
  auVar40._12_4_ = auVar11._12_4_ * auVar28._12_4_;
  auVar38._0_4_ = auVar7._0_4_ * auVar6._0_4_;
  auVar38._4_4_ = auVar7._4_4_ * auVar6._4_4_;
  auVar38._8_4_ = auVar7._8_4_ * auVar6._8_4_;
  auVar38._12_4_ = auVar7._12_4_ * auVar6._12_4_;
  auVar11 = vshufps_avx(auVar12,auVar12,0x52);
  auVar7 = vshufps_avx(auVar12,auVar12,0x5a);
  auVar39._0_4_ = auVar11._0_4_ * auVar8._0_4_;
  auVar39._4_4_ = auVar11._4_4_ * auVar8._4_4_;
  auVar39._8_4_ = auVar11._8_4_ * auVar8._8_4_;
  auVar39._12_4_ = auVar11._12_4_ * auVar8._12_4_;
  auVar11 = vshufps_avx512vl(auVar40,auVar40,0xff);
  auVar12 = vmulss_avx512f(auVar40,ZEXT416((uint)fVar1));
  auVar13 = vmovshdup_avx512vl(auVar40);
  auVar14 = vshufps_avx512vl(auVar38,auVar38,0xff);
  auVar15 = vshufpd_avx512vl(auVar38,auVar38,1);
  auVar16 = vmulss_avx512f(auVar38,ZEXT416((uint)fVar1));
  auVar17 = vmovshdup_avx512vl(auVar38);
  auVar18 = vshufps_avx512vl(auVar38,auVar38,0x4b);
  auVar41 = ZEXT416((uint)fVar1);
  auVar19 = vmulss_avx512f(auVar11,auVar41);
  auVar20 = vmulss_avx512f(auVar13,auVar41);
  auVar11 = vmulss_avx512f(auVar11,ZEXT416((uint)fVar3));
  auVar21 = vmulss_avx512f(auVar40,ZEXT416((uint)fVar3));
  auVar22 = vshufpd_avx512vl(auVar39,auVar39,1);
  auVar23 = vshufps_avx512vl(auVar39,auVar39,0xd2);
  auVar12 = vfmadd231ss_avx512f(auVar12,ZEXT416((uint)fVar2),auVar14);
  auVar42 = ZEXT416((uint)fVar3);
  auVar16 = vfmadd231ss_avx512f(auVar16,auVar15,auVar42);
  auVar15 = vfmadd231ss_avx512f(auVar19,ZEXT416((uint)fVar2),auVar15);
  auVar14 = vfmadd231ss_avx512f(auVar20,auVar14,auVar42);
  auVar19 = vshufpd_avx512vl(auVar40,auVar40,1);
  auVar37 = ZEXT416((uint)fVar2);
  auVar11 = vfmadd231ss_avx512f(auVar11,auVar37,auVar13);
  auVar13 = vfmadd231ss_avx512f(auVar21,auVar38,auVar37);
  auVar20 = vshufps_avx512vl(auVar39,auVar39,0xff);
  auVar12 = vfmadd231ss_avx512f(auVar12,auVar19,ZEXT416((uint)fVar4));
  auVar16 = vfmadd231ss_avx512f(auVar16,auVar17,ZEXT416((uint)fVar4));
  auVar21 = ZEXT416((uint)fVar4);
  auVar15 = vfmadd231ss_avx512f(auVar15,auVar39,auVar21);
  auVar11 = vfmadd231ss_avx512f(auVar11,auVar20,auVar21);
  auVar14 = vfmadd231ss_avx512f(auVar14,auVar22,auVar21);
  auVar12 = vsubss_avx512f(auVar12,auVar15);
  auVar15 = vmovshdup_avx512vl(auVar39);
  auVar14 = vsubss_avx512f(auVar16,auVar14);
  auVar13 = vfmadd231ss_avx512f(auVar13,auVar15,auVar21);
  auVar11 = vsubss_avx512f(auVar11,auVar13);
  auVar13 = vmulss_avx512f(auVar39,auVar42);
  auVar16 = vmulss_avx512f(auVar19,auVar42);
  auVar16 = vfmadd231ss_avx512f(auVar16,auVar17,auVar37);
  auVar17 = vmulss_avx512f(auVar12,ZEXT416((uint)(m->y).x));
  auVar13 = vfmadd231ss_avx512f(auVar13,auVar37,auVar22);
  auVar17 = vfmadd231ss_avx512f(auVar17,auVar14,ZEXT416((uint)(m->x).x));
  auVar13 = vfmadd231ss_avx512f(auVar13,auVar41,auVar15);
  auVar15 = vfmadd231ss_avx512f(auVar16,auVar20,auVar41);
  auVar16 = vfmadd231ss_avx512f(auVar17,auVar11,ZEXT416((uint)(m->z).x));
  auVar13 = vsubss_avx512f(auVar13,auVar15);
  auVar15 = vfmadd231ss_avx512f(auVar16,auVar13,ZEXT416((uint)(m->w).x));
  (in_RDI->x).x = auVar14._0_4_;
  (in_RDI->x).y = auVar12._0_4_;
  (in_RDI->x).z = auVar11._0_4_;
  (in_RDI->x).w = auVar13._0_4_;
  auVar11 = vshufps_avx(auVar40,auVar40,0x8d);
  auVar12._0_4_ = auVar11._0_4_ * auVar9._0_4_;
  auVar12._4_4_ = auVar11._4_4_ * auVar9._4_4_;
  auVar12._8_4_ = auVar11._8_4_ * auVar9._8_4_;
  auVar12._12_4_ = auVar11._12_4_ * auVar9._12_4_;
  auVar11 = vfmadd231ps_avx512vl(auVar12,auVar24,auVar18);
  auVar12 = vshufps_avx512vl(auVar38,auVar40,0xde);
  auVar13 = vpermi2ps_avx512vl(ZEXT816(0x200000005),auVar40,auVar38);
  auVar14 = vpermt2ps_avx512vl(auVar40,auVar36,auVar38);
  auVar16 = vfmadd231ps_avx512vl(auVar11,auVar25,auVar23);
  auVar11 = vinsertps_avx(auVar14,auVar39,0x30);
  auVar17._0_4_ = auVar11._0_4_ * auVar9._0_4_;
  auVar17._4_4_ = auVar11._4_4_ * auVar9._4_4_;
  auVar17._8_4_ = auVar11._8_4_ * auVar9._8_4_;
  auVar17._12_4_ = auVar11._12_4_ * auVar9._12_4_;
  auVar11 = vinsertps_avx512f(auVar12,auVar39,0xb0);
  auVar9 = vfmadd213ps_fma(auVar11,auVar24,auVar17);
  auVar24 = vshufps_avx512vl(auVar13,auVar39,0x74);
  auVar11 = vshufps_avx(auVar35,auVar35,0xf);
  auVar13 = auVar30._0_16_;
  auVar18._0_4_ = auVar11._0_4_ * auVar30._0_4_;
  auVar18._4_4_ = auVar11._4_4_ * auVar30._4_4_;
  auVar18._8_4_ = auVar11._8_4_ * auVar30._8_4_;
  auVar18._12_4_ = auVar11._12_4_ * auVar30._12_4_;
  auVar9 = vfmadd213ps_fma(auVar24,auVar25,auVar9);
  auVar11 = vshufps_avx(auVar18,auVar18,0x8d);
  auVar19._0_4_ = auVar11._0_4_ * auVar7._0_4_;
  auVar19._4_4_ = auVar11._4_4_ * auVar7._4_4_;
  auVar19._8_4_ = auVar11._8_4_ * auVar7._8_4_;
  auVar19._12_4_ = auVar11._12_4_ * auVar7._12_4_;
  fVar10 = (float4)vsubps_avx(auVar16,auVar9);
  auVar11 = vshufps_avx(auVar35,auVar35,0xb9);
  auVar9 = vshufps_avx(auVar35,auVar35,0x52);
  in_RDI->y = fVar10;
  auVar12 = _DAT_009f1160;
  auVar24 = vshufps_avx(auVar13,auVar13,0xe7);
  auVar25 = vshufps_avx(auVar13,auVar13,0x24);
  auVar16._0_8_ = CONCAT44(auVar24._4_4_ * auVar11._4_4_,auVar24._0_4_ * auVar11._0_4_);
  auVar16._8_4_ = auVar24._8_4_ * auVar11._8_4_;
  auVar16._12_4_ = auVar24._12_4_ * auVar11._12_4_;
  auVar13._0_4_ = auVar25._0_4_ * auVar9._0_4_;
  auVar13._4_4_ = auVar25._4_4_ * auVar9._4_4_;
  auVar13._8_4_ = auVar25._8_4_ * auVar9._8_4_;
  auVar13._12_4_ = auVar25._12_4_ * auVar9._12_4_;
  auVar11 = vshufps_avx(auVar16,auVar16,0x4b);
  auVar24 = vpermi2ps_avx512vl(auVar36,auVar18,auVar16);
  auVar9 = vshufps_avx(auVar13,auVar13,0xd2);
  auVar11 = vfmadd231ps_fma(auVar19,auVar34,auVar11);
  auVar9 = vfmadd231ps_fma(auVar11,auVar26,auVar9);
  auVar11 = vinsertps_avx512f(auVar24,auVar13,0x30);
  auVar24._0_4_ = auVar7._0_4_ * auVar11._0_4_;
  auVar24._4_4_ = auVar7._4_4_ * auVar11._4_4_;
  auVar24._8_4_ = auVar7._8_4_ * auVar11._8_4_;
  auVar24._12_4_ = auVar7._12_4_ * auVar11._12_4_;
  auVar11 = vshufps_avx(auVar16,auVar18,0xde);
  auVar11 = vinsertps_avx(auVar11,auVar13,0xb0);
  auVar7 = vfmadd213ps_fma(auVar11,auVar34,auVar24);
  auVar36._8_8_ = auVar18._8_8_;
  auVar36._0_8_ = auVar16._0_8_;
  auVar24 = vpermi2ps_avx512vl(_DAT_009f1170,auVar16,auVar13);
  auVar11 = vshufps_avx(auVar36,auVar13,0x79);
  auVar11 = vfmadd213ps_fma(auVar11,auVar26,auVar7);
  auVar7 = vshufps_avx(auVar33,auVar33,0x49);
  fVar10 = (float4)vsubps_avx(auVar9,auVar11);
  auVar11 = vshufps_avx(auVar16,auVar13,0xbd);
  in_RDI->z = fVar10;
  auVar9 = vshufps_avx(auVar33,auVar33,0x33);
  auVar14._0_4_ = auVar9._0_4_ * auVar11._0_4_;
  auVar14._4_4_ = auVar9._4_4_ * auVar11._4_4_;
  auVar14._8_4_ = auVar9._8_4_ * auVar11._8_4_;
  auVar14._12_4_ = auVar9._12_4_ * auVar11._12_4_;
  auVar25 = vpermi2ps_avx512vl(auVar12,auVar16,auVar18);
  auVar26 = vpermi2ps_avx512vl(_DAT_009f1150,auVar36,auVar13);
  auVar11 = vshufps_avx(auVar33,auVar33,0x9e);
  auVar9 = vshufps_avx(auVar33,auVar33,0x78);
  auVar34._0_4_ = auVar24._0_4_ * auVar9._0_4_;
  auVar34._4_4_ = auVar24._4_4_ * auVar9._4_4_;
  auVar34._8_4_ = auVar24._8_4_ * auVar9._8_4_;
  auVar34._12_4_ = auVar24._12_4_ * auVar9._12_4_;
  auVar9 = vfmadd213ps_fma(auVar11,auVar26,auVar14);
  auVar11 = vinsertps_avx(auVar25,auVar13,0x30);
  auVar7 = vfmadd213ps_fma(auVar7,auVar11,auVar9);
  auVar11 = vpermi2ps_avx512vl(_DAT_009f1180,auVar13,auVar18);
  auVar11 = vfmadd213ps_fma(auVar11,auVar6,auVar34);
  auVar11 = vshufps_avx(auVar11,auVar11,0x72);
  auVar11 = vfmadd231ps_fma(auVar11,auVar8,auVar25);
  auVar11 = vshufps_avx(auVar11,auVar11,0xd2);
  fVar10 = (float4)vsubps_avx(auVar7,auVar11);
  in_RDI->w = fVar10;
  auVar11 = vdivss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar15);
  auVar31 = vbroadcastss_avx512f(auVar11);
  fVar32 = (float4x4)vmulps_avx512f(auVar31,(undefined1  [64])*in_RDI);
  *in_RDI = fVar32;
  return in_RDI;
}

Assistant:

float4x4 Inverse(const float4x4 &m)
{
	float4x4 d;
	float *dst = &d.x.x;
	float tmp[12]; /* temp array for pairs */
	float src[16]; /* array of transpose source matrix */
	float det; /* determinant */
	/* transpose matrix */
	for ( int i = 0; i < 4; i++) {
		src[i] = m(i,0) ;
		src[i + 4] = m(i,1);
		src[i + 8] = m(i,2);
		src[i + 12] = m(i,3); 
	}
	/* calculate pairs for first 8 elements (cofactors) */
	tmp[0]  = src[10] * src[15];
	tmp[1]  = src[11] * src[14];
	tmp[2]  = src[9] * src[15];
	tmp[3]  = src[11] * src[13];
	tmp[4]  = src[9] * src[14];
	tmp[5]  = src[10] * src[13];
	tmp[6]  = src[8] * src[15];
	tmp[7]  = src[11] * src[12];
	tmp[8]  = src[8] * src[14];
	tmp[9]  = src[10] * src[12];
	tmp[10] = src[8] * src[13];
	tmp[11] = src[9] * src[12];
	/* calculate first 8 elements (cofactors) */
	dst[0]  = tmp[0]*src[5] + tmp[3]*src[6] + tmp[4]*src[7];
	dst[0] -= tmp[1]*src[5] + tmp[2]*src[6] + tmp[5]*src[7];
	dst[1]  = tmp[1]*src[4] + tmp[6]*src[6] + tmp[9]*src[7];
	dst[1] -= tmp[0]*src[4] + tmp[7]*src[6] + tmp[8]*src[7];
	dst[2]  = tmp[2]*src[4] + tmp[7]*src[5] + tmp[10]*src[7];
	dst[2] -= tmp[3]*src[4] + tmp[6]*src[5] + tmp[11]*src[7];
	dst[3]  = tmp[5]*src[4] + tmp[8]*src[5] + tmp[11]*src[6];
	dst[3] -= tmp[4]*src[4] + tmp[9]*src[5] + tmp[10]*src[6];
	dst[4]  = tmp[1]*src[1] + tmp[2]*src[2] + tmp[5]*src[3];
	dst[4] -= tmp[0]*src[1] + tmp[3]*src[2] + tmp[4]*src[3];
	dst[5]  = tmp[0]*src[0] + tmp[7]*src[2] + tmp[8]*src[3];
	dst[5] -= tmp[1]*src[0] + tmp[6]*src[2] + tmp[9]*src[3];
	dst[6]  = tmp[3]*src[0] + tmp[6]*src[1] + tmp[11]*src[3];
	dst[6] -= tmp[2]*src[0] + tmp[7]*src[1] + tmp[10]*src[3];
	dst[7]  = tmp[4]*src[0] + tmp[9]*src[1] + tmp[10]*src[2];
	dst[7] -= tmp[5]*src[0] + tmp[8]*src[1] + tmp[11]*src[2];
	/* calculate pairs for second 8 elements (cofactors) */
	tmp[0]  = src[2]*src[7];
	tmp[1]  = src[3]*src[6];
	tmp[2]  = src[1]*src[7];
	tmp[3]  = src[3]*src[5];
	tmp[4]  = src[1]*src[6];
	tmp[5]  = src[2]*src[5];
	tmp[6]  = src[0]*src[7];
	tmp[7]  = src[3]*src[4];
	tmp[8]  = src[0]*src[6];
	tmp[9]  = src[2]*src[4];
	tmp[10] = src[0]*src[5];
	tmp[11] = src[1]*src[4];
	/* calculate second 8 elements (cofactors) */
	dst[8]  = tmp[0]*src[13] + tmp[3]*src[14] + tmp[4]*src[15];
	dst[8] -= tmp[1]*src[13] + tmp[2]*src[14] + tmp[5]*src[15];
	dst[9]  = tmp[1]*src[12] + tmp[6]*src[14] + tmp[9]*src[15];
	dst[9] -= tmp[0]*src[12] + tmp[7]*src[14] + tmp[8]*src[15];
	dst[10] = tmp[2]*src[12] + tmp[7]*src[13] + tmp[10]*src[15];
	dst[10]-= tmp[3]*src[12] + tmp[6]*src[13] + tmp[11]*src[15];
	dst[11] = tmp[5]*src[12] + tmp[8]*src[13] + tmp[11]*src[14];
	dst[11]-= tmp[4]*src[12] + tmp[9]*src[13] + tmp[10]*src[14];
	dst[12] = tmp[2]*src[10] + tmp[5]*src[11] + tmp[1]*src[9];
	dst[12]-= tmp[4]*src[11] + tmp[0]*src[9] + tmp[3]*src[10];
	dst[13] = tmp[8]*src[11] + tmp[0]*src[8] + tmp[7]*src[10];
	dst[13]-= tmp[6]*src[10] + tmp[9]*src[11] + tmp[1]*src[8];
	dst[14] = tmp[6]*src[9] + tmp[11]*src[11] + tmp[3]*src[8];
	dst[14]-= tmp[10]*src[11] + tmp[2]*src[8] + tmp[7]*src[9];
	dst[15] = tmp[10]*src[10] + tmp[4]*src[8] + tmp[9]*src[9];
	dst[15]-= tmp[8]*src[9] + tmp[11]*src[10] + tmp[5]*src[8];
	/* calculate determinant */
	det=src[0]*dst[0]+src[1]*dst[1]+src[2]*dst[2]+src[3]*dst[3];
	/* calculate matrix inverse */
	det = 1/det;
	for ( int j = 0; j < 16; j++)
	dst[j] *= det;
	return d;
}